

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack10_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3ff;
  out[1] = *in >> 10 & 0x3ff;
  out[2] = *in >> 0x14 & 0x3ff;
  puVar1 = out + 3;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xff) << 2 | *puVar1;
  out[4] = *puVar2 >> 8 & 0x3ff;
  out[5] = *puVar2 >> 0x12 & 0x3ff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x3f) << 4 | *puVar1;
  out[7] = *puVar2 >> 6 & 0x3ff;
  out[8] = *puVar2 >> 0x10 & 0x3ff;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xf) << 6 | *puVar1;
  out[10] = *puVar2 >> 4 & 0x3ff;
  out[0xb] = *puVar2 >> 0xe & 0x3ff;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 3) << 8 | *puVar1;
  out[0xd] = *puVar2 >> 2 & 0x3ff;
  out[0xe] = *puVar2 >> 0xc & 0x3ff;
  out[0xf] = *puVar2 >> 0x16;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack10_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;
  *out = ((*in) >> 16) % (1U << 10);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 4)) << (10 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 10);
  out++;
  *out = ((*in) >> 14) % (1U << 10);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 2)) << (10 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 10);
  out++;
  *out = ((*in) >> 12) % (1U << 10);
  out++;
  *out = ((*in) >> 22);
  ++in;
  out++;

  return in;
}